

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O1

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  size_t __n;
  char cVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  ostream *poVar4;
  runtime_error *this;
  ApprovalMismatchException *this_00;
  pointer_____offset_0x10___ *ppuVar5;
  stringstream s;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  __n = *(size_t *)(ctx + 8);
  if (__n == *(size_t *)(sig + 8)) {
    if (__n == 0) {
LAB_0011f56c:
      ::std::__cxx11::stringstream::stringstream(local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"Identical filenames for received and approved.\n",0x2f);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"Tests would spuriously pass. \n",0x1e);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"Please check your custom namer. \n",0x21);
      ::std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Received : \"",0xc);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (&local_1a8,*(char **)ctx,*(long *)(ctx + 8));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" \n",3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Approved : \"",0xc);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)sig,*(long *)(sig + 8));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::stringbuf::str();
      ::std::runtime_error::runtime_error(this,local_1d8);
      __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = bcmp(*(void **)ctx,*(void **)sig,__n);
    if (iVar3 == 0) goto LAB_0011f56c;
  }
  bVar2 = FileUtils::fileExists((string *)sig);
  if (bVar2) {
    bVar2 = FileUtils::fileExists((string *)ctx);
    if (bVar2) {
      local_1f8[0] = local_1e8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,*(long *)ctx,*(long *)(ctx + 8) + *(long *)ctx);
      local_218[0] = local_208;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_218,*(long *)sig,*(long *)(sig + 8) + *(long *)sig);
      iVar3 = (**(code **)(*(long *)siglen + 0x10))(siglen,local_1f8,local_218);
      cVar1 = (char)iVar3;
      if (local_218[0] != local_208) {
        operator_delete(local_218[0]);
        iVar3 = extraout_EAX;
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
        iVar3 = extraout_EAX_00;
      }
      if (cVar1 != '\0') {
        return iVar3;
      }
      this_00 = (ApprovalMismatchException *)__cxa_allocate_exception(0x28);
      ApprovalMismatchException::ApprovalMismatchException(this_00,(string *)ctx,(string *)sig);
      ppuVar5 = &ApprovalMismatchException::typeinfo;
      goto LAB_0011f6cf;
    }
    this_00 = (ApprovalMismatchException *)__cxa_allocate_exception(0x28);
    ApprovalMissingException::ApprovalMissingException
              ((ApprovalMissingException *)this_00,(string *)sig,(string *)ctx);
  }
  else {
    this_00 = (ApprovalMismatchException *)__cxa_allocate_exception(0x28);
    ApprovalMissingException::ApprovalMissingException
              ((ApprovalMissingException *)this_00,(string *)ctx,(string *)sig);
  }
  ppuVar5 = &ApprovalMissingException::typeinfo;
LAB_0011f6cf:
  __cxa_throw(this_00,ppuVar5,ApprovalException::~ApprovalException);
}

Assistant:

void FileApprover::verify(const std::string& receivedPath,
                              const std::string& approvedPath,
                              const ApprovalComparator& comparator)
    {
        if (receivedPath == approvedPath)
        {
            std::stringstream s;
            s << "Identical filenames for received and approved.\n"
              << "Tests would spuriously pass. \n"
              << "Please check your custom namer. \n"
              << "Received : \"" << receivedPath << "\" \n"
              << "Approved : \"" << approvedPath << "\"";
            // Do not throw ApprovalException, as we don't want reporters to trigger.
            // They would show two seemingly identical files, due to matching file name.
            throw std::runtime_error(s.str());
        }

        if (!FileUtils::fileExists(approvedPath))
        {
            throw ApprovalMissingException(receivedPath, approvedPath);
        }

        if (!FileUtils::fileExists(receivedPath))
        {
            throw ApprovalMissingException(approvedPath, receivedPath);
        }

        if (!comparator.contentsAreEquivalent(receivedPath, approvedPath))
        {
            throw ApprovalMismatchException(receivedPath, approvedPath);
        }
    }